

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O2

string * __thiscall
glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::
getTCCode_abi_cxx11_
          (string *__return_storage_ptr__,
          TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *this,
          GLuint n_patch_vertices)

{
  ulong uVar1;
  string token;
  string n_patch_vertices_string;
  stringstream n_patch_vertices_sstream;
  allocator<char> local_1e1;
  string local_1e0 [8];
  char *local_1d8;
  undefined1 *local_1c0;
  undefined8 local_1b8;
  undefined1 local_1b0 [16];
  stringstream local_1a0 [16];
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1c0 = local_1b0;
  local_1b8 = 0;
  local_1b0[0] = 0;
  std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1c0,local_1e0);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout(vertices = N_PATCH_VERTICES) out;\n\nout TC_OUT\n{\n    int tc_invocation_id;\n    int tc_patch_vertices_in;\n    int tc_primitive_id;\n} out_te[];\n\nvoid main()\n{\n    gl_out[gl_InvocationID].gl_Position          = gl_in[gl_InvocationID].gl_Position;\n    out_te[gl_InvocationID].tc_invocation_id     = gl_InvocationID;\n    out_te[gl_InvocationID].tc_patch_vertices_in = gl_PatchVerticesIn;\n    out_te[gl_InvocationID].tc_primitive_id      = gl_PrimitiveID;\n\n    gl_TessLevelInner[0] = 4.0;\n    gl_TessLevelInner[1] = 4.0;\n    gl_TessLevelOuter[0] = 4.0;\n    gl_TessLevelOuter[1] = 4.0;\n    gl_TessLevelOuter[2] = 4.0;\n    gl_TessLevelOuter[3] = 4.0;\n}\n"
             ,(allocator<char> *)local_1e0);
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"N_PATCH_VERTICES",&local_1e1);
  while( true ) {
    uVar1 = std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)local_1e0);
    if (uVar1 == 0xffffffffffffffff) break;
    std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar1,local_1d8);
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)local_1e0);
  }
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::getTCCode(
	glw::GLuint n_patch_vertices)
{
	static const char* tc_body =
		"${VERSION}\n"
		"\n"
		"${TESSELLATION_SHADER_REQUIRE}\n"
		"\n"
		"layout(vertices = N_PATCH_VERTICES) out;\n"
		"\n"
		"out TC_OUT\n"
		"{\n"
		"    int tc_invocation_id;\n"
		"    int tc_patch_vertices_in;\n"
		"    int tc_primitive_id;\n"
		"} out_te[];\n"
		"\n"
		"void main()\n"
		"{\n"
		"    gl_out[gl_InvocationID].gl_Position          = gl_in[gl_InvocationID].gl_Position;\n"
		"    out_te[gl_InvocationID].tc_invocation_id     = gl_InvocationID;\n"
		"    out_te[gl_InvocationID].tc_patch_vertices_in = gl_PatchVerticesIn;\n"
		"    out_te[gl_InvocationID].tc_primitive_id      = gl_PrimitiveID;\n"
		"\n"
		"    gl_TessLevelInner[0] = 4.0;\n"
		"    gl_TessLevelInner[1] = 4.0;\n"
		"    gl_TessLevelOuter[0] = 4.0;\n"
		"    gl_TessLevelOuter[1] = 4.0;\n"
		"    gl_TessLevelOuter[2] = 4.0;\n"
		"    gl_TessLevelOuter[3] = 4.0;\n"
		"}\n";

	/* Construct a string out of user-provided integer value */
	std::stringstream n_patch_vertices_sstream;
	std::string		  n_patch_vertices_string;

	n_patch_vertices_sstream << n_patch_vertices;
	n_patch_vertices_string = n_patch_vertices_sstream.str();

	/* Replace N_PATCH_VERTICES with user-provided value */
	std::string		  result	  = tc_body;
	const std::string token		  = "N_PATCH_VERTICES";
	std::size_t		  token_index = std::string::npos;

	while ((token_index = result.find(token)) != std::string::npos)
	{
		result = result.replace(token_index, token.length(), n_patch_vertices_string.c_str());

		token_index = result.find(token);
	}

	return result;
}